

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_kotlin.cpp
# Opt level: O0

unique_ptr<flatbuffers::CodeGenerator,_std::default_delete<flatbuffers::CodeGenerator>_>
flatbuffers::NewKotlinCodeGenerator(void)

{
  KotlinCodeGenerator *this;
  __uniq_ptr_data<flatbuffers::CodeGenerator,_std::default_delete<flatbuffers::CodeGenerator>,_true,_true>
  in_RDI;
  unique_ptr<flatbuffers::(anonymous_namespace)::KotlinCodeGenerator,_std::default_delete<flatbuffers::(anonymous_namespace)::KotlinCodeGenerator>_>
  local_18 [2];
  
  this = (KotlinCodeGenerator *)operator_new(0x28);
  memset(this,0,0x28);
  anon_unknown_28::KotlinCodeGenerator::KotlinCodeGenerator(this);
  std::
  unique_ptr<flatbuffers::(anonymous_namespace)::KotlinCodeGenerator,std::default_delete<flatbuffers::(anonymous_namespace)::KotlinCodeGenerator>>
  ::unique_ptr<std::default_delete<flatbuffers::(anonymous_namespace)::KotlinCodeGenerator>,void>
            ((unique_ptr<flatbuffers::(anonymous_namespace)::KotlinCodeGenerator,std::default_delete<flatbuffers::(anonymous_namespace)::KotlinCodeGenerator>>
              *)local_18,this);
  std::unique_ptr<flatbuffers::CodeGenerator,std::default_delete<flatbuffers::CodeGenerator>>::
  unique_ptr<flatbuffers::(anonymous_namespace)::KotlinCodeGenerator,std::default_delete<flatbuffers::(anonymous_namespace)::KotlinCodeGenerator>,void>
            ((unique_ptr<flatbuffers::CodeGenerator,std::default_delete<flatbuffers::CodeGenerator>>
              *)in_RDI.
                super___uniq_ptr_impl<flatbuffers::CodeGenerator,_std::default_delete<flatbuffers::CodeGenerator>_>
                ._M_t.
                super__Tuple_impl<0UL,_flatbuffers::CodeGenerator_*,_std::default_delete<flatbuffers::CodeGenerator>_>
                .super__Head_base<0UL,_flatbuffers::CodeGenerator_*,_false>._M_head_impl,local_18);
  std::
  unique_ptr<flatbuffers::(anonymous_namespace)::KotlinCodeGenerator,_std::default_delete<flatbuffers::(anonymous_namespace)::KotlinCodeGenerator>_>
  ::~unique_ptr(local_18);
  return (__uniq_ptr_data<flatbuffers::CodeGenerator,_std::default_delete<flatbuffers::CodeGenerator>,_true,_true>
          )(tuple<flatbuffers::CodeGenerator_*,_std::default_delete<flatbuffers::CodeGenerator>_>)
           in_RDI.
           super___uniq_ptr_impl<flatbuffers::CodeGenerator,_std::default_delete<flatbuffers::CodeGenerator>_>
           ._M_t.
           super__Tuple_impl<0UL,_flatbuffers::CodeGenerator_*,_std::default_delete<flatbuffers::CodeGenerator>_>
           .super__Head_base<0UL,_flatbuffers::CodeGenerator_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<CodeGenerator> NewKotlinCodeGenerator() {
  return std::unique_ptr<KotlinCodeGenerator>(new KotlinCodeGenerator());
}